

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

err_t bpkiPrivkeyWrap(octet *epki,size_t *epki_len,octet *privkey,size_t privkey_len,octet *pwd,
                     size_t pwd_len,octet *salt,size_t iter)

{
  bool_t bVar1;
  err_t eVar2;
  size_t iter_00;
  octet *salt_00;
  octet *header;
  octet *key_00;
  octet *src;
  void *buf;
  octet *in_RCX;
  void *in_RDX;
  size_t *in_RSI;
  void *in_RDI;
  octet *in_R8;
  octet *in_R9;
  void *in_stack_00000008;
  err_t code;
  octet *key;
  size_t count;
  size_t edata_len;
  size_t pki_len;
  size_t in_stack_00000090;
  octet *in_stack_00000098;
  octet *in_stack_000000a0;
  size_t in_stack_000001f0;
  octet *in_stack_000001f8;
  size_t in_stack_00000200;
  octet *in_stack_00000208;
  octet *in_stack_00000210;
  size_t in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  err_t local_4;
  
  if (key < (octet *)0x2710) {
    local_4 = 0x6d;
  }
  else if ((((in_RCX == (octet *)0x20) || (in_RCX == (octet *)0x18)) || (in_RCX == (octet *)0x30))
          || (in_RCX == (octet *)0x40)) {
    iter_00 = bpkiPrivkeyEnc(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    if (iter_00 == 0xffffffffffffffff) {
      local_4 = 0x132;
    }
    else {
      salt_00 = (octet *)(iter_00 + 0x10);
      header = (octet *)bpkiEdataEnc(in_stack_00000210,in_stack_00000208,in_stack_00000200,
                                     in_stack_000001f8,in_stack_000001f0);
      if (header == (octet *)0xffffffffffffffff) {
        local_4 = 0x132;
      }
      else {
        if (in_RSI != (size_t *)0x0) {
          bVar1 = memIsValid(in_RSI,8);
          if (bVar1 == 0) {
            return 0x6d;
          }
          *in_RSI = (size_t)header;
        }
        if (in_RDI == (void *)0x0) {
          local_4 = 0;
        }
        else {
          bVar1 = memIsValid(in_RDX,(size_t)in_RCX);
          if (((bVar1 != 0) && (bVar1 = memIsValid(in_RDI,(size_t)header), bVar1 != 0)) &&
             ((bVar1 = memIsValid(in_R8,(size_t)in_R9), bVar1 != 0 &&
              (bVar1 = memIsValid(in_stack_00000008,8), bVar1 != 0)))) {
            key_00 = (octet *)blobCreate(in_stack_ffffffffffffff98);
            if (key_00 == (octet *)0x0) {
              return 0x6e;
            }
            eVar2 = beltPBKDF2(in_RCX,in_R8,(size_t)in_R9,iter_00,salt_00,(size_t)header);
            if (eVar2 != 0) {
              blobClose((blob_t)0x166e94);
              return eVar2;
            }
            src = (octet *)bpkiPrivkeyEnc(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
            eVar2 = 0x1f8;
            if (src != (octet *)0xffffffffffffffff) {
              eVar2 = 0;
            }
            if (eVar2 != 0) {
              memWipe(header,(size_t)key_00);
              blobClose((blob_t)0x166f00);
              return eVar2;
            }
            eVar2 = beltKWPWrap(in_R9,src,(size_t)salt_00,header,key_00,
                                (ulong)in_stack_ffffffffffffffa0);
            if (eVar2 != 0) {
              memWipe(header,(size_t)key_00);
              blobClose((blob_t)0x166f76);
              return eVar2;
            }
            buf = (void *)bpkiEdataEnc(in_stack_00000210,in_stack_00000208,in_stack_00000200,
                                       in_stack_000001f8,in_stack_000001f0);
            eVar2 = 0x132;
            if (buf != (void *)0xffffffffffffffff) {
              eVar2 = 0;
            }
            if (eVar2 != 0) {
              memWipe(buf,(size_t)key_00);
              blobClose((blob_t)0x166fec);
              return eVar2;
            }
            blobClose((blob_t)0x167000);
            return 0;
          }
          local_4 = 0x6d;
        }
      }
    }
  }
  else {
    local_4 = 0x1f8;
  }
  return local_4;
}

Assistant:

err_t bpkiPrivkeyWrap(octet epki[], size_t* epki_len, const octet privkey[],
	size_t privkey_len, const octet pwd[], size_t pwd_len,
	const octet salt[8], size_t iter)
{
	size_t pki_len, edata_len, count;
	octet* key;
	err_t code;
	// проверить входные данные
	if (iter < 10000)
		return ERR_BAD_INPUT;
	if (privkey_len != 32 && privkey_len != 24 && privkey_len != 48 && 
		privkey_len != 64)
		return ERR_BAD_PRIVKEY;
	// определить длину epki
	pki_len = bpkiPrivkeyEnc(0, privkey, privkey_len);
	if (pki_len == SIZE_MAX)
		return ERR_BAD_FORMAT;
	edata_len = pki_len + 16;
	count = bpkiEdataEnc(0, 0, edata_len, 0, iter);
	if (count == SIZE_MAX)
		return ERR_BAD_FORMAT;
	if (epki_len)
	{
		if (!memIsValid(epki_len, O_PER_S))
			return ERR_BAD_INPUT;
		*epki_len = count;
	}
	if (!epki)
		return ERR_OK;
	// проверить указатели
	if (!memIsValid(privkey, privkey_len) ||
		!memIsValid(epki, count) ||
			!memIsValid(pwd, pwd_len) ||
		!memIsValid(salt, 8))
		return ERR_BAD_INPUT;
	// сгенерировать ключ
	key = (octet*)blobCreate(32);
	if (!key)
		return ERR_OUTOFMEMORY;
	code = beltPBKDF2(key, pwd, pwd_len, iter, salt, 8);
	ERR_CALL_HANDLE(code, blobClose(key));
	// кодировать pki
	pki_len = bpkiPrivkeyEnc(epki + count - pki_len, privkey, privkey_len);
	code = pki_len != SIZE_MAX ? ERR_OK : ERR_BAD_PRIVKEY;
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// зашифровать pki
	code = beltKWPWrap(epki + count - pki_len - 16,
		epki + count - pki_len,	pki_len, 0, key, 32);
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// кодировать edata и epki
	count = bpkiEdataEnc(epki, epki + count - edata_len, edata_len,
		salt, iter);
	code = count != SIZE_MAX ? ERR_OK : ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// все нормально
	blobClose(key);
	return ERR_OK;
}